

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

vmdict_TrieNode * __thiscall vmdict_TrieNode::find_word(vmdict_TrieNode *this,char *str,size_t len)

{
  wchar_t wVar1;
  long in_RDX;
  vmdict_TrieNode *in_RDI;
  bool bVar2;
  vmdict_TrieNode *chi;
  wchar_t ch;
  utf8_ptr p;
  vmdict_TrieNode *n;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  vmdict_TrieNode *local_28;
  
  utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  local_28 = in_RDI;
  while( true ) {
    if (in_RDX == 0) {
      return local_28;
    }
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x32af4c);
    local_28 = local_28->chi;
    while( true ) {
      bVar2 = false;
      if (local_28 != (vmdict_TrieNode *)0x0) {
        bVar2 = local_28->ch != wVar1;
      }
      if (!bVar2) break;
      local_28 = local_28->nxt;
    }
    if (local_28 == (vmdict_TrieNode *)0x0) break;
    utf8_ptr::inc((utf8_ptr *)local_28,(size_t *)in_RDI);
  }
  return (vmdict_TrieNode *)0x0;
}

Assistant:

vmdict_TrieNode *vmdict_TrieNode::find_word(const char *str, size_t len)
{
    vmdict_TrieNode *n;
    utf8_ptr p((char *)str);

    /* scan the string and walk the Trie */
    for (n = this ; len != 0 ; p.inc(&len))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* find the child node for this letter */
        vmdict_TrieNode *chi;
        for (chi = n->chi ; chi != 0 && chi->ch != ch ; chi = chi->nxt) ;

        /* if we didn't find a child, the word isn't in the trie */
        if (chi == 0)
            return 0;

        /* advance to this child node */
        n = chi;
    }

    /* we've reached the final node for the word - return it */
    return n;
}